

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation_p.h
# Opt level: O1

void __thiscall QAbstractAnimationPrivate::emitDirectionChanged(QAbstractAnimationPrivate *this)

{
  QObject *sender;
  long in_FS_OFFSET;
  parameter_type local_2c;
  void *local_28;
  parameter_type *ppStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  sender = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
  local_2c = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
             ::value(&this->direction);
  ppStack_20 = &local_2c;
  local_28 = (void *)0x0;
  QMetaObject::activate(sender,&QAbstractAnimation::staticMetaObject,3,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emitDirectionChanged() { Q_EMIT q_func()->directionChanged(direction); }